

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O2

double __thiscall Fl_Input_::expandpos(Fl_Input_ *this,char *p,char *e,char *buf,int *returnn)

{
  byte c;
  int iVar1;
  int iVar2;
  uint uVar3;
  double extraout_XMM0_Qa;
  
  if (((this->super_Fl_Widget).type_ & 7) == 5) {
    uVar3 = 0;
    for (; p < e; p = p + iVar1) {
      iVar1 = fl_utf8len(*p);
      iVar2 = 0;
      if (0 < iVar1) {
        iVar2 = l_secret;
      }
      uVar3 = uVar3 + iVar2;
    }
  }
  else {
    iVar2 = 0;
    uVar3 = 0;
    for (; p < e; p = (char *)((byte *)p + 1)) {
      c = *p;
      if (c < 0x20 || c == 0x7f) {
        if ((c == 9) && (((this->super_Fl_Widget).type_ & 7) == 4)) {
          uVar3 = (uVar3 - iVar2 % 8) + 8;
          iVar2 = (iVar2 - iVar2 % 8) + 7;
        }
        else {
          uVar3 = uVar3 + 2;
        }
      }
      else {
        uVar3 = uVar3 + 1;
      }
      iVar1 = fl_utf8len(c);
      iVar2 = iVar2 + (uint)(0 < iVar1);
    }
  }
  if (returnn != (int *)0x0) {
    *returnn = uVar3;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x37])
            (fl_graphics_driver,buf,(ulong)uVar3);
  return extraout_XMM0_Qa;
}

Assistant:

double Fl_Input_::expandpos(
  const char* p,	// real string
  const char* e,	// pointer into real string
  const char* buf,	// conversion of real string by expand()
  int* returnn		// return offset into buf here
) const {
  int n = 0;
  int chr = 0;
  int l;
  if (input_type()==FL_SECRET_INPUT) {
    while (p<e) {
      l = fl_utf8len((char)p[0]);
      if (l >= 1) n += l_secret;
      p += l;
    }
  } else while (p<e) {
    int c = *p & 255;
    if (c < ' ' || c == 127) {
      if (c == '\t' && input_type()==FL_MULTILINE_INPUT) {
         n += 8-(chr%8);
         chr += 7-(chr%8);
      } else n += 2;
    } else {
      n++;
    }
    chr += fl_utf8len((char)p[0]) >= 1;
    p++;
  }
  if (returnn) *returnn = n;
  return fl_width(buf, n);
}